

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildUnionEnumSwitchCase
          (SwiftGenerator *this,EnumDef *ed,string *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,string *indentation,bool is_vector)

{
  bool bVar1;
  char *pcVar2;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar3;
  reference ppEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  byte local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined1 local_478 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> constructor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  byte local_2f1;
  string local_2f0;
  byte local_2c9;
  string local_2c8;
  undefined1 local_2a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  undefined1 local_280 [8];
  string variant;
  EnumVal ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_1b0;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  char *local_e8;
  char *vector_reader;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  string ns_type;
  bool is_vector_local;
  string *indentation_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *buffer_constructor_local;
  string *field_local;
  EnumDef *ed_local;
  SwiftGenerator *this_local;
  
  ns_type.field_2._M_local_buf[0xf] = is_vector;
  IdlNamer::NamespacedType_abi_cxx11_((string *)local_58,&this->namer_,&ed->super_Definition);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"VALUETYPE",&local_79);
  CodeWriter::SetValue(&this->code_,&local_78,(string *)local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"{{ACCESS_TYPE}} var {{FIELDVAR}}: \\",&local_b1);
  CodeWriter::operator+=(&this->code_,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pcVar2 = "{{VALUETYPE}}Union?";
  if ((ns_type.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar2 = "[{{VALUETYPE}}Union?]";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,pcVar2,(allocator<char> *)((long)&vector_reader + 7));
  CodeWriter::operator+=(&this->code_,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&vector_reader + 7));
  local_e8 = "";
  if ((ns_type.field_2._M_local_buf[0xf] & 1U) != 0) {
    local_e8 = "(at: index";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 indentation,"switch _t.");
  std::operator+(&local_188,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                 ,field);
  std::operator+(&local_168,&local_188,"Type");
  std::operator+(&local_148,&local_168,local_e8);
  pcVar2 = "";
  if ((ns_type.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar2 = ")";
  }
  std::operator+(&local_128,&local_148,pcVar2);
  std::operator+(&local_108,&local_128," {");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(buffer_constructor,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&it);
  pvVar3 = EnumDef::Vals(ed);
  local_1b0._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar3);
  while( true ) {
    pvVar3 = EnumDef::Vals(ed);
    ev.value = (int64_t)std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                        ::end(pvVar3);
    bVar1 = __gnu_cxx::operator<
                      (&local_1b0,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev.value);
    if (!bVar1) break;
    ppEVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_1b0);
    EnumVal::EnumVal((EnumVal *)((long)&variant.field_2 + 8),*ppEVar4);
    IdlNamer::LegacySwiftVariant_abi_cxx11_
              ((string *)local_280,&this->namer_,(EnumVal *)((long)&variant.field_2 + 8));
    if ((int)ev.doc_comment.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
      type.field_2._12_4_ = 4;
    }
    else {
      bVar1 = IsStruct((Type *)&ev.doc_comment.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_2c9 = 0;
      local_2f1 = 0;
      if (bVar1) {
        GenType_abi_cxx11_(&local_2c8,this,
                           (Type *)&ev.doc_comment.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
        local_2c9 = 1;
        Mutable_abi_cxx11_(&local_2f0,this);
        local_2f1 = 1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a8,&local_2c8,&local_2f0);
      }
      else {
        GenType_abi_cxx11_((string *)local_2a8,this,
                           (Type *)&ev.doc_comment.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      }
      if ((local_2f1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2f0);
      }
      if ((local_2c9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2c8);
      }
      std::operator+(&local_358,indentation,"case .");
      std::operator+(&local_338,&local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280)
      ;
      std::operator+(&local_318,&local_338,":");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&constructor.field_2 + 8),indentation,"  var _v = _t.");
      std::operator+(&local_438,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&constructor.field_2 + 8),field);
      pcVar2 = "(";
      if ((ns_type.field_2._M_local_buf[0xf] & 1U) != 0) {
        pcVar2 = "";
      }
      std::operator+(&local_418,&local_438,pcVar2);
      std::operator+(&local_3f8,&local_418,local_e8);
      pcVar2 = "";
      if ((ns_type.field_2._M_local_buf[0xf] & 1U) != 0) {
        pcVar2 = ", ";
      }
      std::operator+(&local_3d8,&local_3f8,pcVar2);
      std::operator+(&local_3b8,&local_3d8,"type: ");
      std::operator+(&local_398,&local_3b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8)
      ;
      std::operator+(&local_378,&local_398,".self)");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)(constructor.field_2._M_local_buf + 8));
      std::operator+(&local_4b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "Union(_v?.unpack(), type: .");
      std::operator+(&local_498,&local_4b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478,
                     &local_498,")");
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::operator+(&local_518,indentation,"  ");
      std::operator+(&local_4f8,&local_518,field);
      local_559 = 0;
      if ((ns_type.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::operator+(&local_538," = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_478);
      }
      else {
        std::operator+(&local_558,".append(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_478);
        local_559 = 1;
        std::operator+(&local_538,&local_558,")");
      }
      std::operator+(&local_4d8,&local_4f8,&local_538);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_4d8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_538);
      if ((local_559 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_558);
      }
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)local_478);
      std::__cxx11::string::~string((string *)local_2a8);
      type.field_2._12_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_280);
    EnumVal::~EnumVal((EnumVal *)((long)&variant.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_1b0);
  }
  std::operator+(&local_580,indentation,"default: break");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(buffer_constructor,&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  std::operator+(&local_5a0,indentation,"}");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(buffer_constructor,&local_5a0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void BuildUnionEnumSwitchCase(const EnumDef &ed, const std::string &field,
                                std::vector<std::string> &buffer_constructor,
                                const std::string &indentation = "",
                                const bool is_vector = false) {
    const auto ns_type = namer_.NamespacedType(ed);
    code_.SetValue("VALUETYPE", ns_type);
    code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: \\";
    code_ += is_vector ? "[{{VALUETYPE}}Union?]" : "{{VALUETYPE}}Union?";

    const auto vector_reader = is_vector ? "(at: index" : "";
    buffer_constructor.push_back(indentation + "switch _t." + field + "Type" +
                                 vector_reader + (is_vector ? ")" : "") + " {");

    for (auto it = ed.Vals().begin(); it < ed.Vals().end(); ++it) {
      const auto ev = **it;
      const auto variant = namer_.LegacySwiftVariant(ev);
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      const auto type = IsStruct(ev.union_type)
                            ? GenType(ev.union_type) + Mutable()
                            : GenType(ev.union_type);
      buffer_constructor.push_back(indentation + "case ." + variant + ":");
      buffer_constructor.push_back(
          indentation + "  var _v = _t." + field + (is_vector ? "" : "(") +
          vector_reader + (is_vector ? ", " : "") + "type: " + type + ".self)");
      const auto constructor =
          ns_type + "Union(_v?.unpack(), type: ." + variant + ")";
      buffer_constructor.push_back(
          indentation + "  " + field +
          (is_vector ? ".append(" + constructor + ")" : " = " + constructor));
    }
    buffer_constructor.push_back(indentation + "default: break");
    buffer_constructor.push_back(indentation + "}");
  }